

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int convertCompoundSelectToSubquery(Walker *pWalker,Select *p)

{
  uint uVar1;
  Parse *pParse;
  sqlite3 *db;
  Expr **ppEVar2;
  undefined1 uVar3;
  LogEst LVar4;
  u32 uVar5;
  ExprList_item *pEVar6;
  Select *pSVar7;
  SrcList *pSVar8;
  Expr *pExpr;
  ExprList *pEVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  Select *pSVar15;
  Select *pSVar16;
  byte bVar17;
  Token dummy;
  Token local_58;
  Token local_40;
  
  bVar17 = 0;
  iVar14 = 0;
  if (p->pPrior == (Select *)0x0) {
    return 0;
  }
  pEVar9 = p->pOrderBy;
  if (p == (Select *)0x0 || pEVar9 == (ExprList *)0x0) {
    return 0;
  }
  pSVar7 = p;
  while ((pSVar7->op == 0x8a || (pSVar7->op == 0x87))) {
    pSVar7 = pSVar7->pPrior;
    if (pSVar7 == (Select *)0x0) {
      return 0;
    }
  }
  if (pEVar9->a[0].u.x.iOrderByCol != 0) {
    return 0;
  }
  uVar1 = pEVar9->nExpr;
  uVar11 = (ulong)uVar1;
  pEVar6 = pEVar9->a + (uVar11 - 1);
  do {
    uVar10 = (uint)uVar11;
    uVar13 = (int)uVar1 >> 0x1f & uVar1;
    if ((int)uVar10 < 1) break;
    ppEVar2 = &pEVar6->pExpr;
    uVar11 = (ulong)(uVar10 - 1);
    pEVar6 = pEVar6 + -1;
    uVar13 = uVar10;
  } while (((*ppEVar2)->flags & 0x200) == 0);
  if (0 < (int)uVar13) {
    pParse = pWalker->pParse;
    db = pParse->db;
    pSVar7 = (Select *)sqlite3DbMallocZero(db,0x80);
    iVar14 = 2;
    if (pSVar7 != (Select *)0x0) {
      local_58.z = (char *)0x0;
      local_58.n = 0;
      local_58._12_4_ = 0;
      pSVar8 = sqlite3SrcListAppendFromTerm
                         (pParse,(SrcList *)0x0,(Token *)0x0,(Token *)0x0,&local_58,pSVar7,
                          (OnOrUsing *)0x0);
      if (pSVar8 != (SrcList *)0x0) {
        pSVar15 = p;
        pSVar16 = pSVar7;
        for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
          uVar3 = pSVar15->field_0x1;
          LVar4 = pSVar15->nSelectRow;
          uVar5 = pSVar15->selFlags;
          pSVar16->op = pSVar15->op;
          pSVar16->field_0x1 = uVar3;
          pSVar16->nSelectRow = LVar4;
          pSVar16->selFlags = uVar5;
          pSVar15 = (Select *)((long)pSVar15 + (ulong)bVar17 * -0x10 + 8);
          pSVar16 = (Select *)((long)pSVar16 + (ulong)bVar17 * -0x10 + 8);
        }
        p->pSrc = pSVar8;
        local_40.z = (char *)0x0;
        local_40.n = 0;
        pExpr = sqlite3ExprAlloc(db,0xb4,&local_40,0);
        pEVar9 = sqlite3ExprListAppendNew(pParse->db,pExpr);
        p->pEList = pEVar9;
        p->op = 0x8a;
        p->pWhere = (Expr *)0x0;
        pSVar7->pOrderBy = (ExprList *)0x0;
        pSVar7->pGroupBy = (ExprList *)0x0;
        pSVar7->pHaving = (Expr *)0x0;
        p->pWith = (With *)0x0;
        p->pWinDefn = (Window *)0x0;
        p->pPrior = (Select *)0x0;
        p->pNext = (Select *)0x0;
        p->selFlags = p->selFlags & 0xfffefeff | 0x10000;
        pSVar7->pPrior->pNext = pSVar7;
        pSVar7->pLimit = (Expr *)0x0;
        iVar14 = 0;
      }
    }
  }
  return iVar14;
}

Assistant:

static int convertCompoundSelectToSubquery(Walker *pWalker, Select *p){
  int i;
  Select *pNew;
  Select *pX;
  sqlite3 *db;
  struct ExprList_item *a;
  SrcList *pNewSrc;
  Parse *pParse;
  Token dummy;

  if( p->pPrior==0 ) return WRC_Continue;
  if( p->pOrderBy==0 ) return WRC_Continue;
  for(pX=p; pX && (pX->op==TK_ALL || pX->op==TK_SELECT); pX=pX->pPrior){}
  if( pX==0 ) return WRC_Continue;
  a = p->pOrderBy->a;
#ifndef SQLITE_OMIT_WINDOWFUNC
  /* If iOrderByCol is already non-zero, then it has already been matched
  ** to a result column of the SELECT statement. This occurs when the
  ** SELECT is rewritten for window-functions processing and then passed
  ** to sqlite3SelectPrep() and similar a second time. The rewriting done
  ** by this function is not required in this case. */
  if( a[0].u.x.iOrderByCol ) return WRC_Continue;
#endif
  for(i=p->pOrderBy->nExpr-1; i>=0; i--){
    if( a[i].pExpr->flags & EP_Collate ) break;
  }
  if( i<0 ) return WRC_Continue;

  /* If we reach this point, that means the transformation is required. */

  pParse = pWalker->pParse;
  db = pParse->db;
  pNew = sqlite3DbMallocZero(db, sizeof(*pNew) );
  if( pNew==0 ) return WRC_Abort;
  memset(&dummy, 0, sizeof(dummy));
  pNewSrc = sqlite3SrcListAppendFromTerm(pParse,0,0,0,&dummy,pNew,0);
  if( pNewSrc==0 ) return WRC_Abort;
  *pNew = *p;
  p->pSrc = pNewSrc;
  p->pEList = sqlite3ExprListAppend(pParse, 0, sqlite3Expr(db, TK_ASTERISK, 0));
  p->op = TK_SELECT;
  p->pWhere = 0;
  pNew->pGroupBy = 0;
  pNew->pHaving = 0;
  pNew->pOrderBy = 0;
  p->pPrior = 0;
  p->pNext = 0;
  p->pWith = 0;
#ifndef SQLITE_OMIT_WINDOWFUNC
  p->pWinDefn = 0;
#endif
  p->selFlags &= ~SF_Compound;
  assert( (p->selFlags & SF_Converted)==0 );
  p->selFlags |= SF_Converted;
  assert( pNew->pPrior!=0 );
  pNew->pPrior->pNext = pNew;
  pNew->pLimit = 0;
  return WRC_Continue;
}